

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  stbi_uc sVar7;
  int iVar8;
  stbi__uint32 sVar9;
  stbi__uint32 sVar10;
  uint uVar11;
  int depth;
  int iVar12;
  int iVar13;
  undefined8 *puVar14;
  stbi_uc *psVar15;
  uint uVar16;
  char *pcVar17;
  ulong uVar18;
  stbi_uc *psVar19;
  int out_n;
  ushort uVar20;
  uint uVar21;
  uint y;
  uint uVar22;
  uint x;
  uint uVar23;
  stbi_uc *psVar24;
  long lVar25;
  byte bVar26;
  uint uVar27;
  long lVar28;
  uint color;
  ulong uVar29;
  size_t sVar30;
  bool bVar31;
  stbi_uc tc [3];
  stbi__uint16 tc16 [3];
  stbi__uint32 local_47c;
  stbi__uint32 raw_len;
  ulong local_458;
  stbi_uc *local_450;
  long local_448;
  long local_440;
  stbi_uc palette [1024];
  
  tc[0] = '\0';
  tc[1] = '\0';
  tc[2] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar8 = stbi__check_png_header(s);
  if (iVar8 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar31 = true;
  bVar5 = 0;
  color = 0;
  bVar3 = false;
  uVar22 = 0;
  uVar11 = 0;
  uVar27 = 0;
  bVar4 = false;
  bVar26 = 0;
LAB_00117afd:
  sVar9 = stbi__get32be(s);
  uVar18 = (ulong)sVar9;
  sVar10 = stbi__get32be(s);
  if (sVar10 == 0x43674249) {
    bVar3 = true;
LAB_00117c6b:
    stbi__skip(s,sVar9);
  }
  else if (sVar10 == 0x49444154) {
    if (bVar31) goto LAB_00117f7a;
    if ((bVar26 != 0) && (uVar22 == 0)) {
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "no PLTE";
      goto LAB_00117f8d;
    }
    if (scan == 2) {
      s->img_n = (uint)bVar26;
      return 1;
    }
    uVar23 = uVar27 + sVar9;
    if ((int)uVar23 < (int)uVar27) {
      return 0;
    }
    if (uVar11 < uVar23) {
      if (sVar9 < 0x1001) {
        uVar18 = 0x1000;
      }
      if (uVar11 != 0) {
        uVar18 = (ulong)uVar11;
      }
      do {
        sVar30 = uVar18;
        uVar11 = (uint)sVar30;
        uVar18 = (ulong)(uVar11 * 2);
      } while (uVar11 < uVar23);
      psVar15 = (stbi_uc *)realloc(*ppsVar1,sVar30);
      if (psVar15 == (stbi_uc *)0x0) goto LAB_001186fb;
      *ppsVar1 = psVar15;
    }
    else {
      psVar15 = *ppsVar1;
    }
    iVar8 = stbi__getn(s,psVar15 + uVar27,sVar9);
    if (iVar8 == 0) {
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "outofdata";
      goto LAB_00117f8d;
    }
    bVar31 = false;
    uVar27 = uVar23;
  }
  else {
    if (sVar10 != 0x49484452) {
      if (sVar10 == 0x504c5445) {
        if (!bVar31) {
          if ((sVar9 < 0x301) && (uVar22 = (sVar9 & 0xffff) / 3, uVar22 * 3 == sVar9)) {
            for (uVar18 = 0; uVar22 != uVar18; uVar18 = uVar18 + 1) {
              sVar7 = stbi__get8(s);
              palette[uVar18 * 4] = sVar7;
              sVar7 = stbi__get8(s);
              palette[uVar18 * 4 + 1] = sVar7;
              sVar7 = stbi__get8(s);
              palette[uVar18 * 4 + 2] = sVar7;
              palette[uVar18 * 4 + 3] = 0xff;
            }
            bVar31 = false;
            goto LAB_00117f10;
          }
          puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
          pcVar17 = "invalid PLTE";
          goto LAB_00117f8d;
        }
      }
      else if (sVar10 == 0x74524e53) {
        if (!bVar31) {
          if (*ppsVar1 != (stbi_uc *)0x0) {
            puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
            pcVar17 = "tRNS after IDAT";
            goto LAB_00117f8d;
          }
          if (bVar26 == 0) {
            uVar23 = s->img_n;
            if ((uVar23 & 1) != 0) {
              if (uVar23 * 2 != sVar9) goto LAB_00118036;
              if (z->depth == 0x10) {
                for (lVar25 = 0; lVar25 < (int)uVar23; lVar25 = lVar25 + 1) {
                  iVar8 = stbi__get16be(s);
                  tc16[lVar25] = (stbi__uint16)iVar8;
                  uVar23 = s->img_n;
                }
              }
              else {
                for (lVar25 = 0; lVar25 < (int)uVar23; lVar25 = lVar25 + 1) {
                  iVar8 = stbi__get16be(s);
                  tc[lVar25] = ""[z->depth] * (char)iVar8;
                  uVar23 = s->img_n;
                }
              }
              bVar4 = true;
              bVar31 = false;
              bVar26 = 0;
              goto LAB_00117f10;
            }
            puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
            pcVar17 = "tRNS with alpha";
            goto LAB_00117f8d;
          }
          if (scan == 2) {
            s->img_n = 4;
            return 1;
          }
          if (uVar22 == 0) {
            puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
            pcVar17 = "tRNS before PLTE";
            goto LAB_00117f8d;
          }
          if (uVar22 < sVar9) {
LAB_00118036:
            puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
            pcVar17 = "bad tRNS len";
            goto LAB_00117f8d;
          }
          for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
            sVar7 = stbi__get8(s);
            palette[uVar29 * 4 + 3] = sVar7;
          }
          bVar26 = 4;
          bVar31 = false;
          goto LAB_00117f10;
        }
      }
      else if (sVar10 == 0x49454e44) {
        if (!bVar31) {
          if (scan != 0) {
            return 1;
          }
          if (*ppsVar1 != (stbi_uc *)0x0) {
            raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
            psVar15 = (stbi_uc *)
                      stbi_zlib_decode_malloc_guesssize_headerflag
                                ((char *)*ppsVar1,uVar27,raw_len,(int *)&raw_len,(uint)!bVar3);
            z->expanded = psVar15;
            if (psVar15 == (stbi_uc *)0x0) {
              return 0;
            }
            free(z->idata);
            z->idata = (stbi_uc *)0x0;
            iVar8 = s->img_n + 1;
            iVar13 = s->img_n;
            if (bVar4) {
              iVar13 = iVar8;
            }
            out_n = iVar13;
            if (req_comp != 3) {
              out_n = iVar8;
            }
            if (bVar26 != 0) {
              out_n = iVar13;
            }
            if (iVar8 != req_comp) {
              out_n = iVar13;
            }
            s->img_out_n = out_n;
            uVar22 = z->depth;
            local_458 = (ulong)uVar22;
            iVar8 = out_n << (uVar22 == 0x10);
            sVar9 = z->s->img_x;
            sVar10 = z->s->img_y;
            if (bVar5 == 0) {
              iVar8 = stbi__create_png_image_raw
                                (z,z->expanded,raw_len,out_n,sVar9,sVar10,uVar22,color);
              if (iVar8 == 0) {
                return 0;
              }
            }
            else {
              local_47c = raw_len;
              local_450 = z->expanded;
              psVar15 = (stbi_uc *)stbi__malloc_mad3(sVar9,sVar10,iVar8,0);
              sVar30 = (size_t)iVar8;
              for (lVar25 = 0; lVar25 != 7; lVar25 = lVar25 + 1) {
                psVar2 = z->s;
                uVar22 = (&DAT_0011e5b0)[lVar25];
                uVar27 = (&DAT_0011e5f0)[lVar25];
                uVar21 = ~uVar22 + psVar2->img_x + uVar27;
                x = uVar21 / uVar27;
                uVar11 = (&DAT_0011e5d0)[lVar25];
                uVar23 = (&DAT_0011e610)[lVar25];
                uVar16 = ~uVar11 + psVar2->img_y + uVar23;
                y = uVar16 / uVar23;
                if ((uVar27 <= uVar21) && (uVar23 <= uVar16)) {
                  depth = (int)local_458;
                  iVar13 = psVar2->img_n;
                  iVar12 = stbi__create_png_image_raw(z,local_450,local_47c,out_n,x,y,depth,color);
                  if (iVar12 == 0) {
                    free(psVar15);
                    return 0;
                  }
                  uVar16 = (((int)(x * depth * iVar13 + 7) >> 3) + 1) * y;
                  local_440 = (long)(int)y;
                  iVar13 = uVar11 * iVar8;
                  local_448 = lVar25;
                  for (lVar28 = 0; lVar28 < local_440; lVar28 = lVar28 + 1) {
                    psVar24 = psVar15 + (long)(int)uVar22 * sVar30;
                    for (lVar25 = 0; lVar25 < (int)x; lVar25 = lVar25 + 1) {
                      memcpy(psVar24 + z->s->img_x * iVar13,
                             z->out + (lVar28 * (int)x + lVar25) * sVar30,sVar30);
                      psVar24 = psVar24 + (long)(int)uVar27 * sVar30;
                    }
                    iVar13 = iVar13 + uVar23 * iVar8;
                  }
                  free(z->out);
                  local_450 = local_450 + uVar16;
                  local_47c = local_47c - uVar16;
                  lVar25 = local_448;
                }
              }
              z->out = psVar15;
            }
            if (bVar4) {
              psVar15 = z->out;
              iVar13 = z->s->img_y * z->s->img_x;
              iVar8 = s->img_out_n;
              if (z->depth == 0x10) {
                if (iVar8 == 4) {
                  for (lVar25 = 0; iVar13 != (int)lVar25; lVar25 = lVar25 + 1) {
                    if (((*(stbi__uint16 *)(psVar15 + lVar25 * 8) == tc16[0]) &&
                        (*(stbi__uint16 *)(psVar15 + lVar25 * 8 + 2) == tc16[1])) &&
                       (*(stbi__uint16 *)(psVar15 + lVar25 * 8 + 4) == tc16[2])) {
                      (psVar15 + lVar25 * 8 + 6)[0] = '\0';
                      (psVar15 + lVar25 * 8 + 6)[1] = '\0';
                    }
                  }
                }
                else {
                  if (iVar8 != 2) {
                    __assert_fail("out_n == 2 || out_n == 4",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/florentdup[P]projet-info-trou-noir/version_cpp_kerr/stb_image.h"
                                  ,0x129f,
                                  "int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)"
                                 );
                  }
                  for (lVar25 = 0; iVar13 != (int)lVar25; lVar25 = lVar25 + 1) {
                    *(ushort *)(psVar15 + lVar25 * 4 + 2) =
                         -(ushort)(*(stbi__uint16 *)(psVar15 + lVar25 * 4) != tc16[0]);
                  }
                }
              }
              else if (iVar8 == 4) {
                for (lVar25 = 0; iVar13 != (int)lVar25; lVar25 = lVar25 + 1) {
                  if (((psVar15[lVar25 * 4] == tc[0]) && (psVar15[lVar25 * 4 + 1] == tc[1])) &&
                     (psVar15[lVar25 * 4 + 2] == tc[2])) {
                    psVar15[lVar25 * 4 + 3] = '\0';
                  }
                }
              }
              else {
                if (iVar8 != 2) {
                  __assert_fail("out_n == 2 || out_n == 4",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/florentdup[P]projet-info-trou-noir/version_cpp_kerr/stb_image.h"
                                ,0x1286,
                                "int stbi__compute_transparency(stbi__png *, stbi_uc *, int)");
                }
                for (lVar25 = 0; iVar13 != (int)lVar25; lVar25 = lVar25 + 1) {
                  psVar15[lVar25 * 2 + 1] = -(psVar15[lVar25 * 2] != tc[0]);
                }
              }
            }
            if (((bVar3) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
              psVar2 = z->s;
              psVar15 = z->out;
              iVar8 = psVar2->img_y * psVar2->img_x;
              if (psVar2->img_out_n == 4) {
                if (stbi__unpremultiply_on_load == 0) {
                  for (lVar25 = 0; iVar8 != (int)lVar25; lVar25 = lVar25 + 1) {
                    sVar7 = psVar15[lVar25 * 4];
                    psVar15[lVar25 * 4] = psVar15[lVar25 * 4 + 2];
                    psVar15[lVar25 * 4 + 2] = sVar7;
                  }
                }
                else {
                  for (lVar25 = 0; iVar8 != (int)lVar25; lVar25 = lVar25 + 1) {
                    bVar5 = psVar15[lVar25 * 4 + 3];
                    bVar6 = psVar15[lVar25 * 4];
                    if (bVar5 == 0) {
                      psVar15[lVar25 * 4] = psVar15[lVar25 * 4 + 2];
                      psVar15[lVar25 * 4 + 2] = bVar6;
                    }
                    else {
                      uVar22 = (uint)(bVar5 >> 1);
                      uVar20 = (ushort)bVar5;
                      psVar15[lVar25 * 4] =
                           (stbi_uc)(((uint)psVar15[lVar25 * 4 + 2] * 0xff + uVar22 & 0xffff) /
                                    (uint)uVar20);
                      psVar15[lVar25 * 4 + 1] =
                           (stbi_uc)(((uint)psVar15[lVar25 * 4 + 1] * 0xff + uVar22 & 0xffff) /
                                    (uint)uVar20);
                      psVar15[lVar25 * 4 + 2] =
                           (stbi_uc)(((uint)bVar6 * 0xff + uVar22 & 0xffff) / (uint)uVar20);
                    }
                  }
                }
              }
              else {
                if (psVar2->img_out_n != 3) {
                  __assert_fail("s->img_out_n == 4",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/florentdup[P]projet-info-trou-noir/version_cpp_kerr/stb_image.h"
                                ,0x12f0,"void stbi__de_iphone(stbi__png *)");
                }
                while (bVar31 = iVar8 != 0, iVar8 = iVar8 + -1, bVar31) {
                  sVar7 = *psVar15;
                  *psVar15 = psVar15[2];
                  psVar15[2] = sVar7;
                  psVar15 = psVar15 + 3;
                }
              }
            }
            if (bVar26 == 0) {
              if (bVar4) {
                s->img_n = s->img_n + 1;
              }
LAB_0011874c:
              free(z->expanded);
              z->expanded = (stbi_uc *)0x0;
              stbi__get32be(s);
              return 1;
            }
            s->img_n = (uint)bVar26;
            uVar22 = (uint)bVar26;
            if (2 < req_comp) {
              uVar22 = req_comp;
            }
            s->img_out_n = uVar22;
            psVar15 = z->out;
            uVar27 = z->s->img_y * z->s->img_x;
            psVar24 = (stbi_uc *)stbi__malloc_mad2(uVar27,uVar22,0);
            if (psVar24 != (stbi_uc *)0x0) {
              uVar18 = 0;
              psVar19 = psVar24;
              if (uVar22 == 3) {
                for (; uVar27 != uVar18; uVar18 = uVar18 + 1) {
                  uVar29 = (ulong)psVar15[uVar18];
                  *psVar19 = palette[uVar29 * 4];
                  psVar19[1] = palette[uVar29 * 4 + 1];
                  psVar19[2] = palette[uVar29 * 4 + 2];
                  psVar19 = psVar19 + 3;
                }
              }
              else {
                for (; uVar27 != uVar18; uVar18 = uVar18 + 1) {
                  *(undefined4 *)(psVar24 + uVar18 * 4) =
                       *(undefined4 *)(palette + (ulong)psVar15[uVar18] * 4);
                }
              }
              free(psVar15);
              z->out = psVar24;
              goto LAB_0011874c;
            }
LAB_001186fb:
            puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
            pcVar17 = "outofmem";
            goto LAB_00117f8d;
          }
          puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
          pcVar17 = "no IDAT";
          goto LAB_00117f8d;
        }
      }
      else if (!bVar31) {
        bVar31 = false;
        if ((sVar10 >> 0x1d & 1) == 0) {
          stbi__parse_png_file::invalid_chunk._0_4_ =
               sVar10 >> 0x18 | (sVar10 & 0xff0000) >> 8 | (sVar10 & 0xff00) << 8 | sVar10 << 0x18;
          puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
          *puVar14 = stbi__parse_png_file::invalid_chunk;
          return 0;
        }
        goto LAB_00117c6b;
      }
LAB_00117f7a:
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "first not IHDR";
      goto LAB_00117f8d;
    }
    if (!bVar31) {
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "multiple IHDR";
      goto LAB_00117f8d;
    }
    if (sVar9 != 0xd) {
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "bad IHDR len";
      goto LAB_00117f8d;
    }
    sVar9 = stbi__get32be(s);
    s->img_x = sVar9;
    if (0x1000000 < sVar9) {
LAB_00117f1d:
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "too large";
LAB_00117f8d:
      *puVar14 = pcVar17;
      return 0;
    }
    sVar9 = stbi__get32be(s);
    s->img_y = sVar9;
    if (0x1000000 < sVar9) goto LAB_00117f1d;
    bVar5 = stbi__get8(s);
    z->depth = (uint)bVar5;
    if ((0x10 < bVar5) || ((0x10116U >> (bVar5 & 0x1f) & 1) == 0)) {
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "1/2/4/8/16-bit only";
      goto LAB_00117f8d;
    }
    bVar6 = stbi__get8(s);
    if (6 < bVar6) {
LAB_00117f47:
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "bad ctype";
      goto LAB_00117f8d;
    }
    color = (uint)bVar6;
    if (bVar6 == 3) {
      bVar26 = 3;
      if (z->depth == 0x10) goto LAB_00117f47;
    }
    else if ((bVar6 & 1) != 0) goto LAB_00117f47;
    sVar7 = stbi__get8(s);
    if (sVar7 != '\0') {
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "bad comp method";
      goto LAB_00117f8d;
    }
    sVar7 = stbi__get8(s);
    if (sVar7 != '\0') {
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "bad filter method";
      goto LAB_00117f8d;
    }
    bVar5 = stbi__get8(s);
    if (1 < bVar5) {
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "bad interlace method";
      goto LAB_00117f8d;
    }
    uVar23 = s->img_x;
    if ((uVar23 == 0) || (uVar16 = s->img_y, uVar16 == 0)) {
      puVar14 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
      pcVar17 = "0-pixel image";
      goto LAB_00117f8d;
    }
    if (bVar26 == 0) {
      uVar21 = (uint)(3 < bVar6) + (bVar6 & 2) + 1;
      s->img_n = uVar21;
      if ((uint)((0x40000000 / (ulong)uVar23) / (ulong)uVar21) < uVar16) goto LAB_00117f1d;
      bVar31 = false;
      bVar26 = 0;
      if (scan == 2) {
        return 1;
      }
    }
    else {
      s->img_n = 1;
      bVar31 = false;
      if ((uint)(0x40000000 / (ulong)uVar23 >> 2) < uVar16) goto LAB_00117f1d;
    }
  }
LAB_00117f10:
  stbi__get32be(s);
  goto LAB_00117afd;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}